

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::TZDBNameSearchHandler::handleMatch
          (TZDBNameSearchHandler *this,int32_t matchLength,CharacterNode *node,UErrorCode *status)

{
  int iVar1;
  UElement *pUVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  UVector *this_00;
  MatchInfoCollection *pMVar6;
  UTimeZoneNameType nameType;
  int32_t index;
  undefined4 in_register_00000034;
  char *__s2;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  UVector *pUVar11;
  bool bVar12;
  UVector *local_98;
  UnicodeString local_70;
  
  __s2 = (char *)CONCAT44(in_register_00000034,matchLength);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar4 = '\x01';
    if (node->fValues != (void *)0x0) {
      if (node->fHasValuesVector == '\0') {
        uVar8 = 1;
      }
      else {
        uVar8 = *(uint *)((long)node->fValues + 8);
      }
      pcVar7 = (char *)0x0;
      pUVar11 = (UVector *)0x0;
      if (0 < (int)uVar8) {
        local_98 = (UVector *)0x0;
        do {
          this_00 = (UVector *)node->fValues;
          index = (int32_t)pcVar7;
          if (node->fHasValuesVector != '\0') {
            this_00 = (UVector *)UVector::elementAt(this_00,index);
            __s2 = pcVar7;
          }
          if (this_00 == (UVector *)0x0) {
            bVar12 = false;
          }
          else {
            bVar12 = false;
            if ((this_00->count & this->fTypes) != 0) {
              pUVar2 = this_00->elements;
              if (pUVar2 == (UElement *)0x0) {
                if (local_98 == (UVector *)0x0) {
                  pUVar11 = this_00;
                  local_98 = this_00;
                }
              }
              else {
                iVar1 = *(int *)&this_00->deleter;
                if ((long)iVar1 < 1) {
                  bVar3 = true;
                }
                else {
                  pcVar7 = this->fRegion;
                  bVar3 = false;
                  uVar9 = 1;
                  do {
                    __s2 = (char *)pUVar2[uVar9 - 1].pointer;
                    iVar5 = strcmp(pcVar7,__s2);
                    if (iVar5 == 0) {
                      bVar3 = true;
                      pUVar11 = this_00;
                      break;
                    }
                    bVar12 = uVar9 < (ulong)(long)iVar1;
                    uVar9 = uVar9 + 1;
                  } while (bVar12);
                  bVar3 = !bVar3;
                }
                bVar12 = (bool)(bVar3 ^ 1);
                if (pUVar11 != (UVector *)0x0) {
                  this_00 = pUVar11;
                }
                if (bVar3) {
                  pUVar11 = this_00;
                }
              }
            }
          }
        } while ((!bVar12) && (uVar10 = index + 1, pcVar7 = (char *)(ulong)uVar10, uVar10 != uVar8))
        ;
      }
      if (pUVar11 != (UVector *)0x0) {
        nameType = pUVar11->count;
        if (((char)pUVar11->capacity != '\0') &&
           (((nameType == UTZNM_SHORT_DAYLIGHT || (nameType == UTZNM_SHORT_STANDARD)) &&
            ((~this->fTypes & 0x30) == 0)))) {
          nameType = UTZNM_SHORT_GENERIC;
        }
        if (this->fResults == (MatchInfoCollection *)0x0) {
          pMVar6 = (MatchInfoCollection *)UMemory::operator_new((UMemory *)0x10,(size_t)__s2);
          if (pMVar6 == (MatchInfoCollection *)0x0) {
            pMVar6 = (MatchInfoCollection *)0x0;
          }
          else {
            TimeZoneNames::MatchInfoCollection::MatchInfoCollection(pMVar6);
          }
          this->fResults = pMVar6;
          if (pMVar6 == (MatchInfoCollection *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
        }
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pMVar6 = this->fResults;
          UnicodeString::UnicodeString(&local_70,(UChar *)(pUVar11->super_UObject)._vptr_UObject,-1)
          ;
          TimeZoneNames::MatchInfoCollection::addMetaZone
                    (pMVar6,nameType,matchLength,&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
          if (U_ZERO_ERROR < *status) {
            return '\x01';
          }
          if (matchLength <= this->fMaxMatchLen) {
            return '\x01';
          }
          this->fMaxMatchLen = matchLength;
          return '\x01';
        }
      }
      UVar4 = '\x01';
    }
  }
  else {
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }